

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool __thiscall ELFIO::elfio::layout_segments_and_their_sections(elfio *this)

{
  _Bit_pointer *this_00;
  bool bVar1;
  byte bVar2;
  Elf_Half EVar3;
  short sVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  reference ppsVar8;
  pointer peVar9;
  undefined4 extraout_var;
  long lVar10;
  ulong uVar11;
  section *psVar12;
  undefined4 extraout_var_00;
  ulong uVar13;
  reference rVar14;
  ulong local_170;
  byte local_145;
  Elf64_Off adjustment;
  Elf64_Off req_page_alignment;
  Elf64_Off cur_page_alignment;
  Elf_Xword align;
  _Bit_type local_c8;
  Elf_Xword local_c0;
  Elf_Xword seg_start_pos;
  Elf_Xword segment_filesize;
  Elf_Xword segment_memory;
  segment *seg;
  iterator __end2;
  iterator __begin2;
  vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *__range2;
  allocator<bool> local_5a;
  bool local_59;
  undefined1 local_58 [8];
  vector<bool,_std::allocator<bool>_> section_generated;
  vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> worklist;
  elfio *this_local;
  
  std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::vector
            ((vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)
             &section_generated.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  EVar3 = Sections::size(&this->sections);
  local_59 = false;
  std::allocator<bool>::allocator(&local_5a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_58,(ulong)EVar3,&local_59,&local_5a);
  std::allocator<bool>::~allocator(&local_5a);
  get_ordered_segments
            ((vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)&__range2,this);
  std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::operator=
            ((vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)
             &section_generated.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage,
             (vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)&__range2);
  std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::~vector
            ((vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)&__range2);
  this_00 = &section_generated.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_end_of_storage;
  __end2 = std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::begin
                     ((vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)this_00);
  seg = (segment *)
        std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::end
                  ((vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<ELFIO::segment_**,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
                                *)&seg);
    if (!bVar1) {
      this_local._7_1_ = true;
LAB_0010f078:
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_58);
      std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::~vector
                ((vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)
                 &section_generated.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage);
      return this_local._7_1_;
    }
    ppsVar8 = __gnu_cxx::
              __normal_iterator<ELFIO::segment_**,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
              ::operator*(&__end2);
    segment_memory = (Elf_Xword)*ppsVar8;
    segment_filesize = 0;
    seg_start_pos = 0;
    local_c0 = this->current_file_pos;
    iVar6 = (**(code **)(*(long *)segment_memory + 0x18))();
    if ((iVar6 == 6) && (sVar4 = (**(code **)(*(long *)segment_memory + 0xb0))(), sVar4 == 0)) {
      peVar9 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::
               operator->(&this->header);
      iVar6 = (*peVar9->_vptr_elf_header[0x1e])();
      local_c0 = CONCAT44(extraout_var,iVar6);
      peVar9 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::
               operator->(&this->header);
      iVar6 = (*peVar9->_vptr_elf_header[9])();
      peVar9 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::
               operator->(&this->header);
      iVar7 = (*peVar9->_vptr_elf_header[0x1c])();
      seg_start_pos = (ulong)(ushort)iVar6 * (ulong)(ushort)iVar7;
      segment_filesize = seg_start_pos;
    }
    else {
      bVar2 = (**(code **)(*(long *)segment_memory + 0xc0))();
      if (((bVar2 & 1) == 0) ||
         (lVar10 = (**(code **)(*(long *)segment_memory + 0x88))(), lVar10 != 0)) {
        sVar4 = (**(code **)(*(long *)segment_memory + 0xb0))();
        local_145 = 0;
        if (sVar4 != 0) {
          uVar5 = (**(code **)(*(long *)segment_memory + 0xb8))(segment_memory,0);
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_58,(ulong)uVar5);
          local_c8 = rVar14._M_mask;
          align = (Elf_Xword)rVar14._M_p;
          bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&align);
          local_145 = bVar1 ^ 0xff;
        }
        if ((local_145 & 1) == 0) {
          sVar4 = (**(code **)(*(long *)segment_memory + 0xb0))();
          if (sVar4 != 0) {
            uVar5 = (**(code **)(*(long *)segment_memory + 0xb8))(segment_memory,0);
            psVar12 = Sections::operator[](&this->sections,(uint)uVar5);
            iVar6 = (*psVar12->_vptr_section[0x17])();
            local_c0 = CONCAT44(extraout_var_00,iVar6);
          }
        }
        else {
          lVar10 = (**(code **)(*(long *)segment_memory + 0x38))();
          if (lVar10 == 0) {
            local_170 = 1;
          }
          else {
            local_170 = (**(code **)(*(long *)segment_memory + 0x38))();
          }
          uVar13 = this->current_file_pos;
          uVar11 = (**(code **)(*(long *)segment_memory + 0x48))();
          lVar10 = (**(code **)(*(long *)segment_memory + 0x38))();
          this->current_file_pos =
               (lVar10 + (uVar11 % local_170 - uVar13 % local_170)) % local_170 +
               this->current_file_pos;
          local_c0 = this->current_file_pos;
        }
      }
      else {
        local_c0 = 0;
        sVar4 = (**(code **)(*(long *)segment_memory + 0xb0))();
        if (sVar4 != 0) {
          seg_start_pos = this->current_file_pos;
          segment_filesize = seg_start_pos;
        }
      }
    }
    bVar1 = write_segment_data(this,(segment *)segment_memory,
                               (vector<bool,_std::allocator<bool>_> *)local_58,&segment_filesize,
                               &seg_start_pos,&local_c0);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_0010f078;
    }
    (**(code **)(*(long *)segment_memory + 0x70))(segment_memory,&seg_start_pos);
    uVar13 = (**(code **)(*(long *)segment_memory + 0x78))();
    if (uVar13 < segment_filesize) {
      (**(code **)(*(long *)segment_memory + 0x80))(segment_memory,&segment_filesize);
    }
    (**(code **)(*(long *)segment_memory + 200))(segment_memory,&local_c0);
    __gnu_cxx::
    __normal_iterator<ELFIO::segment_**,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool layout_segments_and_their_sections()
    {
        std::vector<segment*> worklist;
        std::vector<bool>     section_generated( sections.size(), false );

        // Get segments in a order in where segments which contain a
        // sub sequence of other segments are located at the end
        worklist = get_ordered_segments();

        for ( auto* seg : worklist ) {
            Elf_Xword segment_memory   = 0;
            Elf_Xword segment_filesize = 0;
            Elf_Xword seg_start_pos    = current_file_pos;
            // Special case: PHDR segment
            // This segment contains the program headers but no sections
            if ( seg->get_type() == PT_PHDR && seg->get_sections_num() == 0 ) {
                seg_start_pos  = header->get_segments_offset();
                segment_memory = segment_filesize =
                    header->get_segment_entry_size() *
                    static_cast<Elf_Xword>( header->get_segments_num() );
            }
            // Special case:
            else if ( seg->is_offset_initialized() && seg->get_offset() == 0 ) {
                seg_start_pos = 0;
                if ( seg->get_sections_num() > 0 ) {
                    segment_memory = segment_filesize = current_file_pos;
                }
            }
            // New segments with not generated sections
            // have to be aligned
            else if ( seg->get_sections_num() > 0 &&
                      !section_generated[seg->get_section_index_at( 0 )] ) {
                Elf_Xword align = seg->get_align() > 0 ? seg->get_align() : 1;
                Elf64_Off cur_page_alignment = current_file_pos % align;
                Elf64_Off req_page_alignment =
                    seg->get_virtual_address() % align;
                Elf64_Off adjustment = req_page_alignment - cur_page_alignment;

                current_file_pos += ( seg->get_align() + adjustment ) % align;
                seg_start_pos = current_file_pos;
            }
            else if ( seg->get_sections_num() > 0 ) {
                seg_start_pos =
                    sections[seg->get_section_index_at( 0 )]->get_offset();
            }

            // Write segment's data
            if ( !write_segment_data( seg, section_generated, segment_memory,
                                      segment_filesize, seg_start_pos ) ) {
                return false;
            }

            seg->set_file_size( segment_filesize );

            // If we already have a memory size from loading an elf file (value > 0),
            // it must not shrink!
            // Memory size may be bigger than file size and it is the loader's job to do something
            // with the surplus bytes in memory, like initializing them with a defined value.
            if ( seg->get_memory_size() < segment_memory ) {
                seg->set_memory_size( segment_memory );
            }

            seg->set_offset( seg_start_pos );
        }

        return true;
    }